

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_features_change(lys_module *module,char *name,int op)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  lys_feature *plVar4;
  int iVar5;
  lys_module *plVar6;
  long lVar7;
  long lVar8;
  ly_ctx *ctx;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  lys_feature *plVar12;
  ulong uVar13;
  bool bVar14;
  int local_4c;
  uint local_3c;
  int local_38;
  int local_34;
  
  if (name == (char *)0x0 || module == (lys_module *)0x0) {
LAB_0015c0d8:
    uVar10 = 1;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_features_change");
  }
  else {
    if (*name == '*') {
      bVar14 = name[1] != '\0';
    }
    else {
      bVar14 = true;
      if (*name == '\0') goto LAB_0015c0d8;
    }
    local_34 = 1;
    uVar13 = 1;
    while ((local_34 != 0 && ((int)uVar13 != 0))) {
      local_34 = 0;
      local_3c = 0;
      lVar7 = -1;
      while (lVar8 = lVar7, lVar8 < (long)(ulong)module->inc_size) {
        plVar6 = module;
        if (lVar8 + 1 != 0) {
          plVar6 = (lys_module *)module->inc[lVar8].submodule;
        }
        plVar4 = plVar6->features;
        bVar2 = plVar6->features_size;
        for (uVar13 = 0; lVar7 = lVar8 + 1, uVar13 != bVar2; uVar13 = uVar13 + 1) {
          if ((bVar14 == false) || (iVar5 = strcmp(plVar4[uVar13].name,name), iVar5 == 0)) {
            if (op == 0) {
              if ((plVar4[uVar13].flags >> 8 & 1) != 0) {
                lys_features_disable_recursive(plVar4 + uVar13);
                local_34 = local_34 + 1;
              }
            }
            else if ((plVar4[uVar13].flags >> 8 & 1) == 0) {
              plVar12 = plVar4 + uVar13;
              lVar7 = 0;
              uVar11 = 0;
              while( true ) {
                bVar3 = plVar12->iffeature_size;
                uVar10 = (uint)uVar11;
                if (bVar3 <= uVar11) break;
                iVar5 = resolve_iffeature((lys_iffeature *)((long)&plVar12->iffeature->expr + lVar7)
                                         );
                if (iVar5 == 0) {
                  if (bVar14 != false) {
                    ctx = module->ctx;
                    pcVar9 = plVar12->name;
                    uVar13 = (ulong)(uVar10 + 1);
                    goto LAB_0015c28e;
                  }
                  local_3c = uVar10 + 1;
                  bVar3 = plVar12->iffeature_size;
                  local_4c = (int)lVar8;
                  local_38 = (int)uVar13;
                  break;
                }
                uVar11 = uVar11 + 1;
                lVar7 = lVar7 + 0x20;
              }
              if (uVar10 == bVar3) {
                pbVar1 = (byte *)((long)&plVar12->flags + 1);
                *pbVar1 = *pbVar1 | 1;
                local_34 = local_34 + 1;
              }
            }
            if (bVar14 != false) {
              return 0;
            }
          }
        }
      }
      uVar13 = (ulong)local_3c;
    }
    if ((int)uVar13 == 0) {
      uVar10 = (uint)bVar14;
    }
    else {
      ctx = module->ctx;
      if (local_4c != -1) {
        module = (lys_module *)module->inc[local_4c].submodule;
      }
      pcVar9 = module->features[local_38].name;
LAB_0015c28e:
      ly_log(ctx,LY_LLERR,LY_EINVAL,"Feature \"%s\" is disabled by its %d. if-feature condition.",
             pcVar9,uVar13);
      uVar10 = 1;
    }
  }
  return uVar10;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        LOGARG;
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(module->ctx, LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}